

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PStruct * NewStruct(FName *name,PTypeBase *outer)

{
  size_t parm1;
  int iVar1;
  PStruct *this;
  PClass *pPVar2;
  FName local_2c;
  PStruct *local_28;
  PType *stype;
  size_t bucket;
  PTypeBase *outer_local;
  FName *name_local;
  
  pPVar2 = PStruct::RegistrationInfo.MyClass;
  bucket = (size_t)outer;
  outer_local = (PTypeBase *)name;
  iVar1 = FName::operator_cast_to_int(name);
  local_28 = (PStruct *)
             FTypeTable::FindType(&TypeTable,pPVar2,(intptr_t)outer,(long)iVar1,(size_t *)&stype);
  if (local_28 == (PStruct *)0x0) {
    this = (PStruct *)DObject::operator_new((DObject *)0xc0,(size_t)pPVar2);
    FName::FName(&local_2c,name);
    PStruct::PStruct(this,&local_2c,(PTypeBase *)bucket);
    parm1 = bucket;
    pPVar2 = PStruct::RegistrationInfo.MyClass;
    local_28 = this;
    iVar1 = FName::operator_cast_to_int(name);
    FTypeTable::AddType(&TypeTable,(PType *)this,pPVar2,parm1,(long)iVar1,(size_t)stype);
  }
  return local_28;
}

Assistant:

PStruct *NewStruct(FName name, PTypeBase *outer)
{
	size_t bucket;
	PType *stype = TypeTable.FindType(RUNTIME_CLASS(PStruct), (intptr_t)outer, (intptr_t)name, &bucket);
	if (stype == NULL)
	{
		stype = new PStruct(name, outer);
		TypeTable.AddType(stype, RUNTIME_CLASS(PStruct), (intptr_t)outer, (intptr_t)name, bucket);
	}
	return static_cast<PStruct *>(stype);
}